

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

void __thiscall pbrt::ImageTileIntegrator::Render(ImageTileIntegrator *this)

{
  optional<float> oVar1;
  optional<float> oVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  int64_t *piVar6;
  void *pvVar7;
  CameraHandle *pCVar8;
  int iVar9;
  int iVar10;
  aligned_storage_t<sizeof(float),_alignof(float)> aVar11;
  memory_resource *pmVar12;
  undefined4 extraout_var;
  Allocator AVar13;
  undefined4 extraout_var_00;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  Tuple2<pbrt::Point2,_int> TVar17;
  aligned_storage_t<sizeof(int),_alignof(int)> *paVar18;
  size_t sVar19;
  string *name;
  long lVar20;
  int iVar21;
  ulong uVar22;
  char *fmt;
  _Alloc_hider _Var23;
  aligned_storage_t<sizeof(int),_alignof(int)> aVar24;
  long in_FS_OFFSET;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  string_view str;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  CheckCallbackScope _;
  int waveStart;
  int waveEnd;
  Bounds2i pixelBounds;
  Bounds2i cropBounds;
  Point2i va;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> samplers;
  vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> scratchBuffers;
  ImageAndMetadata mse;
  ProgressReporter progress;
  optional<pbrt::Image> referenceImage;
  Bounds2i msePixelBounds;
  CheckCallbackScope local_8bd;
  aligned_storage_t<sizeof(int),_alignof(int)> local_8bc;
  aligned_storage_t<sizeof(int),_alignof(int)> local_8b8;
  aligned_storage_t<sizeof(int),_alignof(int)> local_8b4;
  aligned_storage_t<sizeof(float),_alignof(float)> local_8b0;
  int iStack_8ac;
  aligned_storage_t<sizeof(float),_alignof(float)> aStack_8a8;
  int iStack_8a4;
  FILE *local_8a0;
  CameraHandle *local_898;
  ImageChannelValues local_890;
  Bounds2i local_860;
  code *pcStack_850;
  code *pcStack_848;
  undefined1 local_830 [8];
  undefined1 auStack_828 [8];
  undefined1 auStack_820 [128];
  undefined8 local_7a0 [2];
  bool local_790;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_78c;
  bool local_784;
  aligned_storage_t<sizeof(int),_alignof(int)> local_780;
  uint uStack_77c;
  aligned_storage_t<sizeof(float),_alignof(float)> local_778;
  uint uStack_774;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_770;
  bool local_768;
  undefined7 uStack_767;
  undefined1 local_760 [48];
  float *local_730;
  size_t local_728;
  size_t local_720;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  _Base_ptr local_700;
  _Base_ptr local_6f8;
  ImageTileIntegrator *local_6f0;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> local_6e8;
  ImageChannelDesc local_6d0;
  vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> local_6a0;
  undefined1 local_680 [8];
  uint local_678;
  int iStack_674;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_670;
  undefined1 local_660 [32];
  long local_640 [2];
  long local_630 [13];
  polymorphic_allocator<unsigned_char> local_5c8;
  uchar *local_5c0;
  size_t local_5b8;
  size_t local_5b0;
  polymorphic_allocator<pbrt::Half> local_5a8;
  Half *local_5a0;
  size_t local_598;
  size_t local_590;
  polymorphic_allocator<float> local_588;
  float *local_580;
  size_t local_578;
  size_t local_570;
  bool local_564;
  bool local_520;
  bool local_4dc;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_4d8;
  bool local_4c8;
  bool local_4bc;
  bool local_4b4;
  bool local_4ac;
  bool local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_498;
  aligned_storage_t<sizeof(float),_alignof(float)> local_460;
  char local_45c;
  pointer local_458;
  memory_resource *pmStack_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_448;
  _Alloc_hider _Stack_440;
  size_type sStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  _Alloc_hider _Stack_420;
  char local_418;
  undefined8 local_414;
  undefined8 uStack_40c;
  undefined8 uStack_404;
  undefined8 uStack_3fc;
  undefined8 uStack_3f4;
  undefined8 uStack_3ec;
  undefined8 uStack_3e4;
  undefined8 uStack_3dc;
  char local_3d4;
  undefined8 local_3d0 [2];
  char local_3c0;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_3bc;
  char local_3b4;
  aligned_storage_t<sizeof(int),_alignof(int)> local_3b0;
  char local_3ac;
  aligned_storage_t<sizeof(float),_alignof(float)> local_3a8;
  char local_3a4;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_3a0;
  char local_398;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_390;
  _Any_data local_360;
  code *pcStack_350;
  code *pcStack_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  _Any_data local_320;
  code *local_310;
  code *local_308;
  ColorEncodingHandle local_300;
  optional<float> local_2f8;
  ProgressReporter local_2f0;
  undefined1 local_2a0 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_1e8;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_1c8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> vStack_1a8;
  bool local_188;
  ImageMetadata local_180;
  
  if (*(size_t *)(Options + 0x90) != 0) {
    str._M_str = *(char **)(Options + 0x88);
    str._M_len = *(size_t *)(Options + 0x90);
    SplitStringToInts((optional<std::vector<int,_std::allocator<int>_>_> *)local_2a0,str,',');
    if ((bool)local_290.ptr._0_1_ == false) {
      fmt = "Didn\'t find integer values after --debugstart: %s";
    }
    else {
      piVar6 = (int64_t *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_);
      if (CONCAT44(local_2a0._12_4_,local_2a0._8_4_) - (long)piVar6 == 0xc) {
        local_2f0.totalWork = *piVar6;
        uVar15 = *(uint *)(piVar6 + 1);
        iStack_674 = 0x10000;
        aStack_670._M_allocated_capacity._0_4_ = 0;
        pmVar12 = pstd::pmr::new_delete_resource();
        iVar9 = (*pmVar12->_vptr_memory_resource[2])(pmVar12,0x10000,0x40);
        local_680 = (undefined1  [8])CONCAT44(extraout_var,iVar9);
        local_678 = CONCAT31(local_678._1_3_,true);
        AVar13.memoryResource = pstd::pmr::new_delete_resource();
        SamplerHandle::Clone
                  ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)local_830,
                   &this->samplerPrototype,1,AVar13);
        oVar1 = *(optional<float> *)local_830;
        operator_delete((void *)local_830,auStack_820._0_8_ - (long)local_830);
        local_830 = (undefined1  [8])&local_2f0;
        auStack_828 = (undefined1  [8])&local_890;
        auStack_820._0_8_ = &local_6d0;
        local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
        memoryResource._0_4_ = uVar15;
        local_6d0.offset.alloc.memoryResource =
             (memory_resource *)((ulong)local_6d0.offset.alloc.memoryResource._4_4_ << 0x20);
        local_180.renderTimeSeconds = oVar1;
        detail::DispatchSplit<8>::operator()
                  ((DispatchSplit<8> *)&local_6a0,&local_180,(ulong)oVar1 >> 0x30);
        local_2f8 = oVar1;
        (*(this->super_Integrator)._vptr_Integrator[4])
                  (this,&local_2f0,(ulong)uVar15,&local_2f8,local_680);
        ScratchBuffer::~ScratchBuffer((ScratchBuffer *)local_680);
        if ((bool)local_290.ptr._0_1_ != true) {
          return;
        }
        pvVar7 = (void *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_);
        if (pvVar7 == (void *)0x0) {
          return;
        }
        operator_delete(pvVar7,(long)local_290.alloc.memoryResource - (long)pvVar7);
        return;
      }
      fmt = "Didn\'t find three integer values after --debugstart: %s";
    }
    ErrorExit<std::__cxx11::string&>
              (fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (Options + 0x88));
  }
  if (*(char *)(in_FS_OFFSET + -0x2e8) == '\0') {
    *(undefined8 *)(in_FS_OFFSET + -0x2f0) = 0;
    *(undefined1 *)(in_FS_OFFSET + -0x2e8) = 1;
  }
  local_320 = (_Any_data)0x0;
  local_308 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:138:26)>
              ::_M_invoke;
  local_310 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:138:26)>
              ::_M_manager;
  CheckCallbackScope::CheckCallbackScope
            (&local_8bd,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_320);
  if (local_310 != (code *)0x0) {
    (*local_310)(&local_320,&local_320,__destroy_functor);
  }
  local_6a0.super__Vector_base<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a0.super__Vector_base<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a0.super__Vector_base<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (iVar9 = 0; iVar10 = MaxThreadIndex(), iVar9 < iVar10; iVar9 = iVar9 + 1) {
    local_680 = (undefined1  [8])0x0;
    local_678 = local_678 & 0xffffff00;
    iStack_674 = 0x10000;
    aStack_670._M_allocated_capacity._0_4_ = 0;
    pmVar12 = pstd::pmr::new_delete_resource();
    iVar10 = (*pmVar12->_vptr_memory_resource[2])(pmVar12,0x10000,0x40);
    local_680 = (undefined1  [8])CONCAT44(extraout_var_00,iVar10);
    local_678 = CONCAT31(local_678._1_3_,1);
    std::vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>::
    emplace_back<pbrt::ScratchBuffer>(&local_6a0,(ScratchBuffer *)local_680);
    ScratchBuffer::~ScratchBuffer((ScratchBuffer *)local_680);
  }
  iVar9 = MaxThreadIndex();
  AVar13.memoryResource = pstd::pmr::new_delete_resource();
  SamplerHandle::Clone(&local_6e8,&this->samplerPrototype,iVar9,AVar13);
  uVar14 = *(ulong *)(((this->camera).
                       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                       .bits & 0xffffffffffff) + 0x340) & 0xffffffffffff;
  oVar1 = *(optional<float> *)(uVar14 + 8);
  oVar2 = *(optional<float> *)(uVar14 + 0x10);
  uVar14 = (this->samplerPrototype).
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           .bits;
  uVar15 = (uint)(ushort)(uVar14 >> 0x30);
  if (uVar14 >> 0x30 < 5) {
    if (uVar15 < 3) {
      paVar18 = (aligned_storage_t<sizeof(int),_alignof(int)> *)
                ((uVar14 & 0xffffffffffff) + (ulong)(uVar15 != 2) * 8);
    }
    else {
      paVar18 = (aligned_storage_t<sizeof(int),_alignof(int)> *)
                ((ulong)((uVar15 & 6) == 2) * 0x10 + (uVar14 & 0xffffffffffff));
    }
    aVar24 = *paVar18;
  }
  else if (uVar15 - 4 < 3) {
    aVar24 = *(aligned_storage_t<sizeof(int),_alignof(int)> *)
              ((aligned_storage_t<sizeof(int),_alignof(int)> *)(uVar14 & 0xffffffffffff))->__data;
    if (uVar15 - 4 == 2) {
      aVar24.__data =
           aVar24.__data *
           ((aligned_storage_t<sizeof(int),_alignof(int)> *)(uVar14 & 0xffffffffffff))[1];
    }
  }
  else {
    aVar24 = *(aligned_storage_t<sizeof(int),_alignof(int)> *)(uVar14 & 0xffffffffffff);
  }
  local_680 = (undefined1  [8])&aStack_670;
  _local_8b0 = oVar1;
  _aStack_8a8 = oVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"Rendering","");
  ProgressReporter::ProgressReporter
            (&local_2f0,
             (long)(((int)oVar2.optionalValue - (int)oVar1.optionalValue) *
                   (oVar2._4_4_ - oVar1._4_4_)) * (long)(int)aVar24,(string *)local_680,
             *(bool *)(Options + 9),false);
  if (local_680 != (undefined1  [8])&aStack_670) {
    operator_delete((void *)local_680,
                    CONCAT44(aStack_670._M_allocated_capacity._4_4_,
                             aStack_670._M_allocated_capacity._0_4_) + 1);
  }
  local_8bc = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_8b4 = (aligned_storage_t<sizeof(int),_alignof(int)>)0x1;
  local_898 = &this->camera;
  if (*(char *)(Options + 10) == '\x01') {
    local_830 = *(undefined1 (*) [8])
                 (((local_898->
                   super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                   ).bits & 0xffffffffffff) + 0x340);
    FilmHandle::GetFilename_abi_cxx11_((string *)local_2a0,(FilmHandle *)local_830);
    RemoveExtension((string *)local_680,(string *)local_2a0);
    StatsEnablePixelStats((Bounds2i *)&local_8b0.__align,(string *)local_680);
    if (local_680 != (undefined1  [8])&aStack_670) {
      operator_delete((void *)local_680,
                      CONCAT44(aStack_670._M_allocated_capacity._4_4_,
                               aStack_670._M_allocated_capacity._0_4_) + 1);
    }
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != &local_290) {
      operator_delete((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                      (long)local_290.alloc.memoryResource + 1);
    }
  }
  local_188 = false;
  local_8b8 = aVar24;
  if (*(long *)(Options + 0x50) != 0) {
    name = (string *)(Options + 0x48);
    AVar13.memoryResource = pstd::pmr::new_delete_resource();
    local_300.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    Image::Read((ImageAndMetadata *)local_680,name,AVar13,&local_300);
    pstd::optional<pbrt::Image>::reset((optional<pbrt::Image> *)local_2a0);
    Image::Image((Image *)local_2a0,(Image *)local_680);
    local_188 = true;
    if (local_4c8 == true) {
      local_180.renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)local_4d8.__align;
      local_180.renderTimeSeconds.set = (bool)local_4d8.__data[4];
      local_180.renderTimeSeconds._5_3_ = local_4d8._5_3_;
      oVar1 = local_180.renderTimeSeconds;
      local_180.cameraFromWorld.optionalValue._0_8_ = local_4d8._8_8_;
      local_180.renderTimeSeconds.optionalValue = SUB84(local_4d8._0_8_,0);
      aVar11 = local_180.renderTimeSeconds.optionalValue;
      local_180.renderTimeSeconds = oVar1;
    }
    else {
      uVar22 = 0;
      aVar11 = (aligned_storage_t<sizeof(float),_alignof(float)>)
               ((int)local_2a0._4_4_ >> 0x1f & local_2a0._4_4_);
      uVar14 = 0;
      if (0 < (int)local_2a0._4_4_) {
        uVar14 = (ulong)(uint)local_2a0._4_4_;
      }
      local_180.renderTimeSeconds._4_4_ = (int)local_2a0._8_4_ >> 0x1f & local_2a0._8_4_;
      local_180.renderTimeSeconds.optionalValue = aVar11;
      if (0 < (int)local_2a0._8_4_) {
        uVar22 = (ulong)(uint)local_2a0._8_4_;
      }
      local_180.cameraFromWorld.optionalValue._0_8_ = uVar14 | uVar22 << 0x20;
    }
    iVar9 = (int)local_8b0 - (int)aVar11;
    if ((int)aVar11 <= (int)local_8b0) {
      if ((int)aStack_8a8 <= (int)local_180.cameraFromWorld.optionalValue.__align) {
        iVar10 = iStack_8ac - local_180.renderTimeSeconds._4_4_;
        if ((int)local_180.renderTimeSeconds._4_4_ <= iStack_8ac) {
          if (iStack_8a4 <= (int)local_180.cameraFromWorld.optionalValue._4_4_) {
            iVar16 = (int)aStack_8a8 - (int)aVar11;
            iVar21 = iStack_8a4 - local_180.renderTimeSeconds._4_4_;
            iVar3 = iVar9;
            if (iVar16 < iVar9) {
              iVar3 = iVar16;
            }
            iVar4 = iVar10;
            if (iVar21 < iVar10) {
              iVar4 = iVar21;
            }
            local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
            memoryResource = (memory_resource *)CONCAT44(iVar4,iVar3);
            if (iVar16 < iVar9) {
              iVar16 = iVar9;
            }
            if (iVar21 < iVar10) {
              iVar21 = iVar10;
            }
            local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr.
            _4_4_ = iVar21;
            local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr.
            _0_4_ = iVar16;
            AVar13.memoryResource = pstd::pmr::new_delete_resource();
            Image::Crop((Image *)local_830,(Image *)local_2a0,(Bounds2i *)&local_890,AVar13);
            if (local_188 == false) {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            local_2a0._8_4_ = auStack_828._0_4_;
            local_2a0._0_4_ = local_830._0_4_;
            local_2a0._4_4_ = local_830._4_4_;
            InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&local_290,
                        (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_820);
            pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                      (&local_1e8,
                       (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                       &local_778.__align);
            pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                      (&local_1c8,
                       (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
                       (local_760 + 8));
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                      (&vStack_1a8,
                       (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(local_760 + 0x28)
                      );
            local_720 = 0;
            (*(*(_func_int ***)local_760._40_8_)[3])(local_760._40_8_,local_730,local_728 << 2,4);
            local_760._32_8_ = (_Base_ptr)0x0;
            (**(code **)(*(long *)CONCAT44(local_760._12_4_,local_760._8_4_) + 0x18))
                      ((long *)CONCAT44(local_760._12_4_,local_760._8_4_),local_760._16_8_,
                       local_760._24_8_ * 2,2);
            aVar24 = local_8b8;
            local_760._0_8_ = 0;
            (**(code **)(*(long *)CONCAT44(uStack_774,local_778) + 0x18))
                      ((long *)CONCAT44(uStack_774,local_778),local_770,
                       CONCAT71(uStack_767,local_768),1);
            InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)auStack_820);
            if (local_188 == false) {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
            }
            local_830._4_4_ = local_2a0._8_4_;
            local_830._0_4_ = local_2a0._4_4_;
            auVar27._8_8_ = 0;
            auVar27._0_4_ = aStack_8a8;
            auVar27[4] = iStack_8a4._0_1_;
            auVar27._5_3_ = iStack_8a4._1_3_;
            auVar29._8_8_ = 0;
            auVar29._0_4_ = local_8b0;
            auVar29[4] = iStack_8ac._0_1_;
            auVar29._5_3_ = iStack_8ac._1_3_;
            auVar27 = vpsubd_avx(auVar27,auVar29);
            local_6d0.offset.alloc.memoryResource = auVar27._0_8_;
            if ((auVar27._0_4_ != local_2a0._4_4_) || (auVar27._4_4_ != local_2a0._8_4_)) {
              LogFatal<char_const(&)[29],char_const(&)[32],char_const(&)[29],pbrt::Point2<int>&,char_const(&)[32],pbrt::Point2<int>&>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                         ,0xba,"Check failed: %s == %s with %s = %s, %s = %s",
                         (char (*) [29])"referenceImage->Resolution()",
                         (char (*) [32])"Point2i(pixelBounds.Diagonal())",
                         (char (*) [29])"referenceImage->Resolution()",(Point2<int> *)local_830,
                         (char (*) [32])"Point2i(pixelBounds.Diagonal())",(Point2<int> *)&local_6d0)
              ;
            }
            local_8a0 = fopen(*(char **)(Options + 0x68),"w");
            lVar20 = Options;
            if (local_8a0 == (FILE *)0x0) {
              LastError();
              ErrorString_abi_cxx11_(0);
              ErrorExit<std::__cxx11::string&,std::__cxx11::string>
                        ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(lVar20 + 0x68),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_830);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&local_498);
            if (local_4a0 == true) {
              local_4a0 = false;
            }
            if (local_4ac == true) {
              local_4ac = false;
            }
            if (local_4b4 == true) {
              local_4b4 = false;
            }
            if (local_4bc == true) {
              local_4bc = false;
            }
            if (local_4c8 == true) {
              local_4c8 = false;
            }
            if (local_4dc == true) {
              local_4dc = false;
            }
            if (local_520 == true) {
              local_520 = false;
            }
            if (local_564 == true) {
              local_564 = false;
            }
            local_570 = 0;
            (*(local_588.memoryResource)->_vptr_memory_resource[3])
                      (local_588.memoryResource,local_580,local_578 << 2,4);
            local_590 = 0;
            (*(local_5a8.memoryResource)->_vptr_memory_resource[3])
                      (local_5a8.memoryResource,local_5a0,local_598 * 2,2);
            local_5b0 = 0;
            (*(local_5c8.memoryResource)->_vptr_memory_resource[3])
                      (local_5c8.memoryResource,local_5c0,local_5b8,1);
            InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&aStack_670);
            goto LAB_0042517b;
          }
        }
      }
    }
    ErrorExit<pbrt::Bounds2<int>&,pbrt::Bounds2<int>&>
              ("Output image pixel bounds %s aren\'t inside the MSE image\'s pixel bounds %s.",
               (Bounds2<int> *)&local_8b0.__align,(Bounds2<int> *)&local_180);
  }
  local_8a0 = (FILE *)0x0;
LAB_0042517b:
  if (*(long *)(Options + 0xb0) != 0) {
    local_180.renderTimeSeconds =
         *(optional<float> *)
          (((local_898->
            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
            ).bits & 0xffffffffffff) + 0x340);
    FilmHandle::GetFilename_abi_cxx11_((string *)local_830,(FilmHandle *)&local_180);
    local_680 = (undefined1  [8])&aStack_670;
    auVar28._8_8_ = 0;
    auVar28._0_4_ = aStack_8a8;
    auVar28[4] = iStack_8a4._0_1_;
    auVar28._5_3_ = iStack_8a4._1_3_;
    auVar30._8_8_ = 0;
    auVar30._0_4_ = local_8b0;
    auVar30[4] = iStack_8ac._0_1_;
    auVar30._5_3_ = iStack_8ac._1_3_;
    auVar27 = vpsubd_avx(auVar28,auVar30);
    local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
    memoryResource = auVar27._0_8_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"R","");
    local_660._0_8_ = local_660 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"G","");
    _Var23._M_p = (pointer)local_630;
    local_640[0] = (long)_Var23._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"B","");
    __l._M_len = 3;
    __l._M_array = (iterator)local_680;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_338,__l,(allocator_type *)&local_6d0);
    oVar1 = local_180.renderTimeSeconds;
    local_360._M_unused._M_object = (void *)0x0;
    local_360._8_8_ = 0;
    pcStack_350 = (code *)0x0;
    pcStack_348 = (code *)0x0;
    local_360._M_unused._M_object = operator_new(0x18);
    aVar24 = local_8b8;
    *(optional<float> *)local_360._M_unused._0_8_ = oVar1;
    pcStack_348 = std::
                  _Function_handler<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:198:24)>
                  ::_M_invoke;
    pcStack_350 = std::
                  _Function_handler<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:198:24)>
                  ::_M_manager;
    *(optional<float> *)((long)local_360._M_unused._0_8_ + 8) = _local_8b0;
    *(optional<float> *)((long)local_360._M_unused._0_8_ + 0x10) = _aStack_8a8;
    DisplayDynamic((string *)local_830,(Point2i *)&local_890,&local_338,
                   (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)&local_360
                  );
    if (pcStack_350 != (code *)0x0) {
      (*pcStack_350)(&local_360,&local_360,__destroy_functor);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_338);
    lVar20 = -0x60;
    do {
      if ((long *)_Var23._M_p != *(long **)((long)_Var23._M_p + -0x10)) {
        operator_delete(*(long **)((long)_Var23._M_p + -0x10),*(long *)_Var23._M_p + 1);
      }
      _Var23._M_p = _Var23._M_p + -0x20;
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0);
    if (local_830 != (undefined1  [8])auStack_820) {
      operator_delete((void *)local_830,(ulong)(auStack_820._0_8_ + 1));
    }
  }
  local_6f0 = this;
  if ((int)local_8bc < (int)aVar24) {
    iVar9 = 1;
    local_6f8 = (_Base_ptr)(local_760 + 8);
    local_700 = &local_180.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
    local_718 = &local_180.stringVectors;
    local_710 = local_7a0;
    local_708 = local_3d0;
    do {
      local_860.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
      local_860.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0;
      local_860.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0;
      local_860.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0;
      pcStack_850 = (code *)0x0;
      pcStack_848 = (code *)0x0;
      local_860.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)operator_new(0x30)
      ;
      *(vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> **)
       local_860.pMin.super_Tuple2<pbrt::Point2,_int> = &local_6a0;
      *(vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> **)
       ((long)local_860.pMin.super_Tuple2<pbrt::Point2,_int> + 8) = &local_6e8;
      *(aligned_storage_t<sizeof(int),_alignof(int)> **)
       ((long)local_860.pMin.super_Tuple2<pbrt::Point2,_int> + 0x10) = &local_8bc;
      *(aligned_storage_t<sizeof(int),_alignof(int)> **)
       ((long)local_860.pMin.super_Tuple2<pbrt::Point2,_int> + 0x18) = &local_8b4;
      *(ImageTileIntegrator **)((long)local_860.pMin.super_Tuple2<pbrt::Point2,_int> + 0x20) =
           local_6f0;
      *(ProgressReporter **)((long)local_860.pMin.super_Tuple2<pbrt::Point2,_int> + 0x28) =
           &local_2f0;
      pcStack_848 = std::
                    _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:212:36)>
                    ::_M_invoke;
      pcStack_850 = std::
                    _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:212:36)>
                    ::_M_manager;
      ParallelFor2D((pbrt *)&local_8b0.__align,&local_860,
                    (function<void_(pbrt::Bounds2<int>)> *)
                    std::
                    _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:212:36)>
                    ::_M_invoke);
      if (pcStack_850 != (code *)0x0) {
        (*pcStack_850)(&local_860,&local_860,3);
      }
      local_8bc = local_8b4;
      local_8b4.__data = local_8b4.__data + iVar9;
      if ((int)local_8b8 <= (int)local_8b4) {
        local_8b4 = local_8b8;
      }
      iVar10 = iVar9 * 2;
      if (0x3f < iVar9 * 2) {
        iVar10 = 0x40;
      }
      if (local_188 == false) {
        iVar9 = iVar10;
      }
      if (LOGGING_LogLevel < 1) {
        local_680 = (undefined1  [8])&aStack_670;
        local_678 = 0;
        iStack_674 = 0;
        aStack_670._M_allocated_capacity._0_4_ = aStack_670._M_allocated_capacity._0_4_ & 0xffffff00
        ;
        detail::stringPrintfRecursive<int&>
                  ((string *)local_680,"Writing image with spp = %d",(int *)local_8bc.__data);
        Log(Verbose,
            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
            ,0xf4,(char *)local_680);
        if (local_680 != (undefined1  [8])&aStack_670) {
          operator_delete((void *)local_680,
                          CONCAT44(aStack_670._M_allocated_capacity._4_4_,
                                   aStack_670._M_allocated_capacity._0_4_) + 1);
        }
      }
      local_830[4] = 0;
      auStack_820[0x38] = '\0';
      auStack_820[0x7c] = '\0';
      local_790 = false;
      local_784 = false;
      uStack_77c = uStack_77c & 0xffffff00;
      uStack_774 = uStack_774 & 0xffffff00;
      local_768 = false;
      local_760._8_4_ = _S_red;
      local_760._16_8_ = (_Base_ptr)0x0;
      local_760._24_8_ = local_6f8;
      local_760._32_8_ = local_6f8;
      local_760._40_8_ = (memory_resource *)0x0;
      lVar20 = std::chrono::_V2::steady_clock::now();
      local_830[4] = 1;
      local_830._0_4_ =
           (float)((double)((lVar20 - (long)local_2f0.timer.start.__d.__r) / 1000) / 1000000.0);
      local_780 = local_8bc;
      uStack_77c = CONCAT31(uStack_77c._1_3_,1);
      if (local_188 == true) {
        local_180.renderTimeSeconds.set = false;
        local_180.cameraFromWorld.set = false;
        local_180.NDCFromWorld.set = false;
        local_180.pixelBounds.set = false;
        local_180.fullResolution.set = false;
        local_180.samplesPerPixel.set = false;
        local_180.MSE.set = false;
        local_180.colorSpace.set = false;
        local_180.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_180.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_180.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_700;
        local_180.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_700;
        local_180.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
        memoryResource =
             *(memory_resource **)
              (((local_898->
                super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                ).bits & 0xffffffffffff) + 0x340);
        FilmHandle::GetImage
                  ((Image *)local_680,(FilmHandle *)&local_890,&local_180,
                   1.0 / (float)(int)local_8bc);
        Image::AllChannelsDesc(&local_6d0,(Image *)local_680);
        if (local_188 == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
        }
        Image::MSE(&local_890,(Image *)local_680,&local_6d0,(Image *)local_2a0,(Image *)0x0);
        local_6d0.offset.nStored = 0;
        (*(local_6d0.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_6d0.offset.alloc.memoryResource,local_6d0.offset.ptr,
                   local_6d0.offset.nAlloc << 2,4);
        fVar25 = 0.0;
        fVar26 = 0.0;
        if (local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
            nStored != 0) {
          TVar17 = (Tuple2<pbrt::Point2,_int>)
                   local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .ptr;
          if ((Tuple2<pbrt::Point2,_int>)
              local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr
              == (Tuple2<pbrt::Point2,_int>)0x0) {
            TVar17 = (Tuple2<pbrt::Point2,_int>)
                     &local_890.
                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      field_2;
          }
          sVar19 = 0;
          do {
            fVar25 = fVar25 + *(float *)((long)TVar17 + sVar19 * 4);
            sVar19 = sVar19 + 1;
            fVar26 = fVar25;
          } while (local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .nStored != sVar19);
        }
        fprintf(local_8a0,"%d, %.9g\n",
                (double)(fVar26 / (float)(long)local_890.
                                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                               .nStored),(ulong)(uint)local_8bc);
        fVar25 = 0.0;
        fVar26 = 0.0;
        if (local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
            nStored != 0) {
          TVar17 = (Tuple2<pbrt::Point2,_int>)
                   local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .ptr;
          if ((Tuple2<pbrt::Point2,_int>)
              local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr
              == (Tuple2<pbrt::Point2,_int>)0x0) {
            TVar17 = (Tuple2<pbrt::Point2,_int>)
                     &local_890.
                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      field_2;
          }
          sVar19 = 0;
          do {
            fVar25 = fVar25 + *(float *)((long)TVar17 + sVar19 * 4);
            sVar19 = sVar19 + 1;
            fVar26 = fVar25;
          } while (local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .nStored != sVar19);
        }
        local_778 = (aligned_storage_t<sizeof(float),_alignof(float)>)
                    (fVar26 / (float)(long)local_890.
                                           super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           .nStored);
        uStack_774 = CONCAT31(uStack_774._1_3_,1);
        fflush(local_8a0);
        local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored =
             0;
        (*(local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
          memoryResource)->_vptr_memory_resource[3])
                  (local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .alloc.memoryResource,
                   local_890.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .ptr,local_890.
                        super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        nAlloc << 2,4);
        local_570 = 0;
        (*(local_588.memoryResource)->_vptr_memory_resource[3])
                  (local_588.memoryResource,local_580,local_578 << 2,4);
        local_590 = 0;
        (*(local_5a8.memoryResource)->_vptr_memory_resource[3])
                  (local_5a8.memoryResource,local_5a0,local_598 * 2,2);
        local_5b0 = 0;
        (*(local_5c8.memoryResource)->_vptr_memory_resource[3])
                  (local_5c8.memoryResource,local_5c0,local_5b8,1);
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&aStack_670);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&local_718->_M_t);
      }
      pCVar8 = local_898;
      CameraHandle::InitMetadata(local_898,(ImageMetadata *)local_830);
      local_680 = *(undefined1 (*) [8])
                   (((pCVar8->
                     super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                     ).bits & 0xffffffffffff) + 0x340);
      local_45c = local_830[4];
      if ((bool)local_830[4] == true) {
        local_460 = (aligned_storage_t<sizeof(float),_alignof(float)>)local_830._0_4_;
      }
      local_418 = auStack_820[0x38];
      if (auStack_820[0x38] == '\x01') {
        local_458 = (pointer)auStack_828;
        pmStack_450 = (memory_resource *)auStack_820._0_8_;
        pbStack_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_820._8_8_;
        _Stack_440._M_p = (pointer)auStack_820._16_8_;
        sStack_438 = auStack_820._24_8_;
        uStack_430 = auStack_820._32_8_;
        uStack_428 = auStack_820._40_8_;
        _Stack_420._M_p = (pointer)auStack_820._48_8_;
      }
      local_3d4 = auStack_820[0x7c];
      if (auStack_820[0x7c] == '\x01') {
        local_414 = auStack_820._60_8_;
        uStack_40c = auStack_820._68_8_;
        uStack_404 = auStack_820._76_8_;
        uStack_3fc = auStack_820._84_8_;
        uStack_3f4 = auStack_820._92_8_;
        uStack_3ec = auStack_820._100_8_;
        uStack_3e4 = auStack_820._108_8_;
        uStack_3dc = auStack_820._116_8_;
      }
      local_3c0 = local_790;
      if (local_790 == true) {
        uVar5 = local_710[1];
        *local_708 = *local_710;
        local_708[1] = uVar5;
      }
      local_3b4 = local_784;
      if (local_784 == true) {
        local_3bc = local_78c;
      }
      local_3ac = uStack_77c._0_1_;
      if (uStack_77c._0_1_ == true) {
        local_3b0 = local_780;
      }
      local_3a4 = uStack_774._0_1_;
      if (uStack_774._0_1_ == true) {
        local_3a8 = local_778;
      }
      local_398 = local_768;
      if (local_768 == true) {
        local_3a0 = local_770;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::_Rb_tree(&local_390,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)local_760);
      FilmHandle::WriteImage
                ((FilmHandle *)local_680,(ImageMetadata *)&local_460.__align,
                 1.0 / (float)(int)local_8bc);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_390);
      if (local_398 == '\x01') {
        local_398 = '\0';
      }
      if (local_3a4 == '\x01') {
        local_3a4 = '\0';
      }
      if (local_3ac == '\x01') {
        local_3ac = '\0';
      }
      if (local_3b4 == '\x01') {
        local_3b4 = '\0';
      }
      if (local_3c0 == '\x01') {
        local_3c0 = '\0';
      }
      if (local_3d4 == '\x01') {
        local_3d4 = '\0';
      }
      if (local_418 == '\x01') {
        local_418 = '\0';
      }
      if (local_45c == '\x01') {
        local_45c = '\0';
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_760);
    } while ((int)local_8bc < (int)local_8b8);
  }
  if (local_8a0 != (FILE *)0x0) {
    fclose(local_8a0);
  }
  ProgressReporter::Done(&local_2f0);
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
        ,0x108,"Rendering finished");
  }
  pstd::optional<pbrt::Image>::reset((optional<pbrt::Image> *)local_2a0);
  ProgressReporter::~ProgressReporter(&local_2f0);
  if (local_6e8.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6e8.
                    super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_6e8.
                          super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6e8.
                          super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>::~vector(&local_6a0);
  CheckCallbackScope::~CheckCallbackScope(&local_8bd);
  return;
}

Assistant:

void ImageTileIntegrator::Render() {
    // Handle debugStart, if set
    if (!Options->debugStart.empty()) {
        pstd::optional<std::vector<int>> c = SplitStringToInts(Options->debugStart, ',');
        if (!c)
            ErrorExit("Didn't find integer values after --debugstart: %s",
                      Options->debugStart);
        if (c->size() != 3)
            ErrorExit("Didn't find three integer values after --debugstart: %s",
                      Options->debugStart);

        Point2i pPixel((*c)[0], (*c)[1]);
        int sampleIndex = (*c)[2];

        ScratchBuffer scratchBuffer(65536);
        SamplerHandle tileSampler = samplerPrototype.Clone(1, Allocator())[0];
        tileSampler.StartPixelSample(pPixel, sampleIndex);

        EvaluatePixelSample(pPixel, sampleIndex, tileSampler, scratchBuffer);

        return;
    }

    thread_local Point2i threadPixel;
    thread_local int threadSampleIndex;
    CheckCallbackScope _([&]() {
        return StringPrintf("Rendering failed at pixel (%d, %d) sample %d. Debug with "
                            "\"--debugstart %d,%d,%d\"\n",
                            threadPixel.x, threadPixel.y, threadSampleIndex,
                            threadPixel.x, threadPixel.y, threadSampleIndex);
    });

    // Declare common variables for rendering image in tiles
    std::vector<ScratchBuffer> scratchBuffers;
    for (int i = 0; i < MaxThreadIndex(); ++i)
        scratchBuffers.push_back(ScratchBuffer(65536));

    std::vector<SamplerHandle> samplers = samplerPrototype.Clone(MaxThreadIndex());

    Bounds2i pixelBounds = camera.GetFilm().PixelBounds();
    int spp = samplerPrototype.SamplesPerPixel();
    ProgressReporter progress(int64_t(spp) * pixelBounds.Area(), "Rendering",
                              Options->quiet);

    int waveStart = 0, waveEnd = 1, nextWaveSize = 1;

    if (Options->recordPixelStatistics)
        StatsEnablePixelStats(pixelBounds,
                              RemoveExtension(camera.GetFilm().GetFilename()));
    // Handle MSE referene image, if provided
    pstd::optional<Image> referenceImage;
    FILE *mseOutFile = nullptr;
    if (!Options->mseReferenceImage.empty()) {
        auto mse = Image::Read(Options->mseReferenceImage);
        referenceImage = mse.image;

        Bounds2i msePixelBounds =
            mse.metadata.pixelBounds
                ? *mse.metadata.pixelBounds
                : Bounds2i(Point2i(0, 0), referenceImage->Resolution());
        if (!Inside(pixelBounds, msePixelBounds))
            ErrorExit("Output image pixel bounds %s aren't inside the MSE "
                      "image's pixel bounds %s.",
                      pixelBounds, msePixelBounds);

        // Transform the pixelBounds of the image we're rendering to the
        // coordinate system with msePixelBounds.pMin at the origin, which
        // in turn gives us the section of the MSE image to crop. (This is
        // complicated by the fact that Image doesn't support pixel
        // bounds...)
        Bounds2i cropBounds(Point2i(pixelBounds.pMin - msePixelBounds.pMin),
                            Point2i(pixelBounds.pMax - msePixelBounds.pMin));
        *referenceImage = referenceImage->Crop(cropBounds);
        CHECK_EQ(referenceImage->Resolution(), Point2i(pixelBounds.Diagonal()));

        mseOutFile = fopen(Options->mseReferenceOutput.c_str(), "w");
        if (!mseOutFile)
            ErrorExit("%s: %s", Options->mseReferenceOutput, ErrorString());
    }

    // Connect to display server if needed
    if (!Options->displayServer.empty()) {
        FilmHandle film = camera.GetFilm();
        DisplayDynamic(film.GetFilename(), Point2i(pixelBounds.Diagonal()),
                       {"R", "G", "B"},
                       [=](Bounds2i b, pstd::span<pstd::span<Float>> displayValue) {
                           int index = 0;
                           for (Point2i p : b) {
                               RGB rgb = film.GetPixelRGB(pixelBounds.pMin + p);
                               for (int c = 0; c < 3; ++c)
                                   displayValue[c][index] = rgb[c];
                               ++index;
                           }
                       });
    }

    // Render image in waves
    while (waveStart < spp) {
        // Render current wave's image tiles in parallel
        ParallelFor2D(pixelBounds, [&](Bounds2i tileBounds) {
            // Render image tile given by _tileBounds_
            ScratchBuffer &scratchBuffer = scratchBuffers[ThreadIndex];
            SamplerHandle &sampler = samplers[ThreadIndex];
            PBRT_DBG("Starting image tile (%d,%d)-(%d,%d) waveStart %d, waveEnd %d\n",
                     tileBounds.pMin.x, tileBounds.pMin.y, tileBounds.pMax.x,
                     tileBounds.pMax.y, waveStart, waveEnd);
            for (Point2i pPixel : tileBounds) {
                StatsReportPixelStart(pPixel);
                threadPixel = pPixel;
                // Render samples in pixel _pPixel_
                for (int sampleIndex = waveStart; sampleIndex < waveEnd; ++sampleIndex) {
                    threadSampleIndex = sampleIndex;
                    sampler.StartPixelSample(pPixel, sampleIndex);
                    EvaluatePixelSample(pPixel, sampleIndex, sampler, scratchBuffer);
                    scratchBuffer.Reset();
                }

                StatsReportPixelEnd(pPixel);
            }
            PBRT_DBG("Finished image tile (%d,%d)-(%d,%d)\n", tileBounds.pMin.x,
                     tileBounds.pMin.y, tileBounds.pMax.x, tileBounds.pMax.y);
            progress.Update((waveEnd - waveStart) * tileBounds.Area());
        });

        // Update start and end wave
        waveStart = waveEnd;
        waveEnd = std::min(spp, waveEnd + nextWaveSize);
        if (!referenceImage)
            nextWaveSize = std::min(2 * nextWaveSize, 64);

        // Write current image to disk
        LOG_VERBOSE("Writing image with spp = %d", waveStart);
        ImageMetadata metadata;
        metadata.renderTimeSeconds = progress.ElapsedSeconds();
        metadata.samplesPerPixel = waveStart;
        if (referenceImage) {
            ImageMetadata filmMetadata;
            Image filmImage = camera.GetFilm().GetImage(&filmMetadata, 1.f / waveStart);
            ImageChannelValues mse =
                filmImage.MSE(filmImage.AllChannelsDesc(), *referenceImage);
            fprintf(mseOutFile, "%d, %.9g\n", waveStart, mse.Average());
            metadata.MSE = mse.Average();
            fflush(mseOutFile);
        }
        camera.InitMetadata(&metadata);
        camera.GetFilm().WriteImage(metadata, 1.0f / waveStart);
    }

    if (mseOutFile)
        fclose(mseOutFile);
    progress.Done();
    LOG_VERBOSE("Rendering finished");
}